

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsstyle.cpp
# Opt level: O1

int __thiscall
QWindowsStyle::pixelMetric(QWindowsStyle *this,PixelMetric pm,QStyleOption *opt,QWidget *widget)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  QStyle *pQVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  qreal qVar8;
  
  iVar2 = QWindowsStylePrivate::fixedPixelMetric(pm);
  if (iVar2 != -0x5c18) {
    qVar8 = (qreal)iVar2;
LAB_003a9bf6:
    qVar8 = QStyleHelper::dpiScaled(qVar8,opt);
    return (int)qVar8;
  }
  if ((int)pm < 0x19) {
    if (pm == PM_MaximumDragDistance) {
      iVar2 = QCommonStyle::pixelMetric(&this->super_QCommonStyle,PM_MaximumDragDistance,opt,widget)
      ;
      if (iVar2 == -1) {
        return 0x3c;
      }
      return iVar2;
    }
    if (pm == PM_SliderControlThickness) {
      if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (opt->type != 0xf0001)) {
        opt = (QStyleOption *)0x0;
      }
      if (opt == (QStyleOption *)0x0) {
        return 0;
      }
      uVar1 = opt[1].rect.y1.m_i;
      bVar7 = opt[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i == 1;
      iVar2 = ((&(opt->rect).x2)[bVar7].m_i - (&(opt->rect).x1)[bVar7].m_i) + 1;
      iVar6 = (uVar1 & 1) + (uint)((uVar1 >> 1 & 1) != 0);
      if (iVar6 == 0) {
        return iVar2;
      }
      iVar5 = 6;
      if ((uVar1 != 0) && (uVar1 != 3)) {
        pQVar4 = QStyle::proxy((QStyle *)(ulong)uVar1);
        iVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0xd,opt,widget);
        iVar5 = iVar3 + 3;
        if (-1 < iVar3) {
          iVar5 = iVar3;
        }
        iVar5 = (iVar5 >> 2) + 6;
      }
      if (iVar2 - iVar5 == 0 || iVar2 < iVar5) {
        return iVar5;
      }
      return (uint)((iVar2 - iVar5) * 2) / (iVar6 + 2U) + iVar5;
    }
  }
  else {
    if (pm == PM_SplitterWidth) {
      qVar8 = 4.0;
      goto LAB_003a9bf6;
    }
    if (pm == PM_IconViewIconSize) {
      pQVar4 = QStyle::proxy((QStyle *)CONCAT44(extraout_var,iVar2));
      iVar2 = (**(code **)(*(long *)pQVar4 + 0xe0))
                        (pQVar4,0x3f,opt,widget,*(code **)(*(long *)pQVar4 + 0xe0));
      return iVar2;
    }
  }
  iVar2 = QCommonStyle::pixelMetric(&this->super_QCommonStyle,pm,opt,widget);
  return iVar2;
}

Assistant:

int QWindowsStyle::pixelMetric(PixelMetric pm, const QStyleOption *opt, const QWidget *widget) const
{
    int ret = QWindowsStylePrivate::pixelMetricFromSystemDp(pm, opt, widget);
    if (ret != QWindowsStylePrivate::InvalidMetric)
        return ret;

    ret = QWindowsStylePrivate::fixedPixelMetric(pm);
    if (ret != QWindowsStylePrivate::InvalidMetric)
        return int(QStyleHelper::dpiScaled(ret, opt));

    ret = 0;

    switch (pm) {
    case PM_MaximumDragDistance:
        ret = QCommonStyle::pixelMetric(PM_MaximumDragDistance, opt, widget);
        if (ret == -1)
            ret = 60;
        break;

#if QT_CONFIG(slider)
        // Returns the number of pixels to use for the business part of the
        // slider (i.e., the non-tickmark portion). The remaining space is shared
        // equally between the tickmark regions.
    case PM_SliderControlThickness:
        if (const QStyleOptionSlider *sl = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            int space = (sl->orientation == Qt::Horizontal) ? sl->rect.height() : sl->rect.width();
            int ticks = sl->tickPosition;
            int n = 0;
            if (ticks & QSlider::TicksAbove)
                ++n;
            if (ticks & QSlider::TicksBelow)
                ++n;
            if (!n) {
                ret = space;
                break;
            }

            int thick = 6;        // Magic constant to get 5 + 16 + 5
            if (ticks != QSlider::TicksBothSides && ticks != QSlider::NoTicks)
                thick += proxy()->pixelMetric(PM_SliderLength, sl, widget) / 4;

            space -= thick;
            if (space > 0)
                thick += (space * 2) / (n + 2);
            ret = thick;
        }
        break;
#endif // QT_CONFIG(slider)

    case PM_IconViewIconSize:
        ret = proxy()->pixelMetric(PM_LargeIconSize, opt, widget);
        break;

    case PM_SplitterWidth:
        ret = QStyleHelper::dpiScaled(4, opt);
        break;

    default:
        ret = QCommonStyle::pixelMetric(pm, opt, widget);
        break;
    }

    return ret;
}